

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool tinyusdz::GeomSubset::ValidateSubsets
               (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                *subsets,size_t elementCount,FamilyType *familyType,string *err)

{
  TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *this;
  ElementType EVar1;
  int iVar2;
  pointer ppGVar3;
  undefined8 uVar4;
  string *psVar5;
  bool bVar6;
  ElementType *pEVar7;
  pointer ppGVar8;
  long lVar9;
  GeomSubset *pGVar10;
  ElementType v;
  ElementType v_00;
  pointer pcVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined8 uVar13;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar14;
  int32_t index;
  int minIndex;
  Animatable<std::vector<int,_std::allocator<int>_>_> indices;
  set<int,_std::less<int>,_std::allocator<int>_> indicesInFamily;
  size_t maxIndex;
  stringstream ss;
  undefined1 local_2c8 [8];
  GeomSubset *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined8 local_2a8;
  pointer local_298;
  string *local_290;
  FamilyType *local_288;
  undefined1 local_280 [24];
  undefined1 local_268 [32];
  pointer local_248;
  undefined1 uStack_240;
  undefined7 uStack_23f;
  undefined1 uStack_238;
  undefined8 uStack_237;
  undefined1 local_228 [32];
  _Base_ptr local_208;
  pointer local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  ppGVar8 = (subsets->
            super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppGVar8 ==
      (subsets->
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
LAB_00367bd0:
    bVar12 = true;
  }
  else {
    local_298 = (pointer)elementCount;
    local_290 = err;
    local_288 = familyType;
    local_280._0_8_ = elementCount;
    pEVar7 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value
                       (&(*ppGVar8)->elementType);
    EVar1 = *pEVar7;
    ppGVar8 = (subsets->
              super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppGVar3 = (subsets->
              super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (ppGVar8 == ppGVar3) {
        local_228._24_8_ = local_228 + 8;
        local_228._8_4_ = _S_red;
        local_228._16_8_ = 0;
        local_200 = (pointer)0x0;
        local_208 = (_Base_ptr)local_228._24_8_;
        ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        ppGVar8 = (subsets->
                  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_280._8_8_ =
             (subsets->
             super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        bVar12 = true;
        while( true ) {
          if (ppGVar8 == (pointer)local_280._8_8_) break;
          pGVar10 = *ppGVar8;
          uStack_238 = 0;
          uStack_237 = 0;
          local_248 = (pointer)0x0;
          uStack_240 = 0;
          uStack_23f = 0;
          local_268._16_2_ = 0;
          local_268._18_8_ = 0;
          local_268._0_8_ = (pointer)0x0;
          local_268._8_2_ = 0;
          local_268._10_6_ = 0;
          local_2c0 = pGVar10;
          local_280._16_8_ = ppGVar8;
          bVar6 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
                  get_value(&pGVar10->indices,
                            (Animatable<std::vector<int,_std::allocator<int>_>_> *)local_268);
          if (!bVar6) {
            ::std::__cxx11::string::string
                      ((string *)&local_1f8,
                       "GeomSubset {}\'s indices is not value Attribute. Connection or ValueBlock?\n"
                       ,(allocator *)local_2b8._M_local_buf);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_1d8,(fmt *)&local_1f8,(string *)&local_2c0->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar10)
            ;
            ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_1d8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            bVar12 = false;
          }
          if ((bool)local_268[0x19] == true) {
            ::std::__cxx11::string::string
                      ((string *)&local_1f8,"GeomSubset {}\'s indices is Value Blocked.\n",
                       (allocator *)local_2b8._M_local_buf);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_1d8,(fmt *)&local_1f8,(string *)&local_2c0->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar10)
            ;
            ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_1d8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            bVar12 = false;
          }
          if ((local_268._18_8_ & 0x1000000000000) == 0) {
            ::std::__cxx11::string::string
                      ((string *)&local_1f8,
                       "ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n",
                       (allocator *)local_2b8._M_local_buf);
            fmt::format(&local_1d8,&local_1f8);
            ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_1d8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            bVar12 = false;
          }
          local_2b8._M_allocated_capacity = 0;
          local_2b8._8_8_ = (int *)0x0;
          local_2a8 = 0;
          bVar6 = Animatable<std::vector<int,_std::allocator<int>_>_>::get_scalar
                            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_268,
                             (vector<int,_std::allocator<int>_> *)&local_2b8);
          if (!bVar6) {
            ::std::__cxx11::string::string
                      ((string *)&local_1f8,
                       "ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n",
                       (allocator *)local_2c8);
            fmt::format(&local_1d8,&local_1f8);
            ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_1d8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            bVar12 = false;
          }
          uVar4 = local_2b8._8_8_;
          local_2c0 = (GeomSubset *)&local_2c0->name;
          for (uVar13 = local_2b8._M_allocated_capacity; uVar13 != uVar4; uVar13 = uVar13 + 4) {
            local_2c8._0_4_ = *(undefined4 *)uVar13;
            pVar14 = ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                     ::_M_insert_unique<int_const&>
                               ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                 *)local_228,(int *)local_2c8);
            if ((((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (*local_288 != Unrestricted)) {
              ::std::__cxx11::string::string
                        ((string *)&local_1f8,"Found overlapping index {} in GeomSubset `{}`\n",
                         (allocator *)(local_2c8 + 7));
              fmt::format<int,std::__cxx11::string>
                        (&local_1d8,(fmt *)&local_1f8,(string *)local_2c8,(int *)local_2c0,in_R8);
              ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_1d8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              bVar12 = false;
            }
          }
          ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_2b8);
          Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
                    ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_268);
          ppGVar8 = (pointer)(local_280._16_8_ + 8);
        }
        pcVar11 = local_298;
        if ((*local_288 == Partition) && (local_200 != local_298)) {
          ::std::__cxx11::string::string
                    ((string *)&local_1d8,
                     "ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n"
                     ,(allocator *)local_2b8._M_local_buf);
          local_1f8._M_dataplus._M_p = local_200;
          fmt::format<unsigned_long,unsigned_long>
                    ((string *)local_268,(fmt *)&local_1d8,&local_1f8,(unsigned_long *)local_280,
                     (unsigned_long *)in_R8);
          ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)local_268);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          bVar12 = false;
          pcVar11 = (pointer)local_280._0_8_;
        }
        lVar9 = ::std::_Rb_tree_decrement((_Rb_tree_node_base *)(local_228 + 8));
        local_1f8._M_dataplus._M_p = (pointer)(long)*(int *)(lVar9 + 0x20);
        iVar2 = *(int *)(local_228._24_8_ + 0x20);
        local_2b8._M_allocated_capacity._0_4_ = iVar2;
        if (pcVar11 <= local_1f8._M_dataplus._M_p) {
          ::std::__cxx11::string::string
                    ((string *)&local_1d8,
                     "ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n"
                     ,(allocator *)local_2c8);
          fmt::format<unsigned_long,unsigned_long>
                    ((string *)local_268,(fmt *)&local_1d8,(string *)local_280,
                     (unsigned_long *)&local_1f8,(unsigned_long *)in_R8);
          ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)local_268);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          bVar12 = false;
        }
        if (iVar2 < 0) {
          ::std::__cxx11::string::string
                    ((string *)&local_1d8,
                     "ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n"
                     ,(allocator *)local_2c8);
          fmt::format<int>((string *)local_268,&local_1d8,(int *)local_2b8._M_local_buf);
          ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)local_268);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          bVar12 = false;
        }
        psVar5 = local_290;
        if ((local_290 != (string *)0x0) && (!bVar12)) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)psVar5);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        ::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_228);
        goto LAB_00367bd0;
      }
      pGVar10 = *ppGVar8;
      this = &pGVar10->elementType;
      pEVar7 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value(this);
      psVar5 = local_290;
      ppGVar8 = ppGVar8 + 1;
    } while (*pEVar7 == EVar1);
    if (local_290 != (string *)0x0) {
      ::std::__cxx11::string::string
                ((string *)local_268,"GeomSubset {}\'s elementType must be `{}`, but got `{}`.\n",
                 (allocator *)&local_1f8);
      tinyusdz::to_string_abi_cxx11_((string *)local_228,(tinyusdz *)(ulong)EVar1,v);
      pEVar7 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value(this);
      tinyusdz::to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*pEVar7,v_00);
      fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_1b8,(fmt *)local_268,&pGVar10->name,(string *)local_228,&local_1d8,
                 in_R9);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_1b8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool GeomSubset::ValidateSubsets(
    const std::vector<const GeomSubset *> &subsets,
    const size_t elementCount,
    const FamilyType &familyType, std::string *err) {

  if (subsets.empty()) {
    return true;
  }

  // All subsets must have the same elementType.
  GeomSubset::ElementType elementType = subsets[0]->elementType.get_value();
  for (const auto psubset : subsets) {
    if (psubset->elementType.get_value() != elementType) {
      if (err) {
        (*err) = fmt::format("GeomSubset {}'s elementType must be `{}`, but got `{}`.\n",
          psubset->name, to_string(elementType), to_string(psubset->elementType.get_value()));
      }

      return false;
    }
  }

  std::set<int32_t> indicesInFamily;

  bool valid = true;
  std::stringstream ss;

  // TODO: TimeSampled indices
  for (const auto psubset : subsets) {
    Animatable<std::vector<int32_t>> indices;
    if (!psubset->indices.get_value(&indices)) {
      ss << fmt::format("GeomSubset {}'s indices is not value Attribute. Connection or ValueBlock?\n",
          psubset->name);

      valid = false;
    }

    if (indices.is_blocked()) {
      ss << fmt::format("GeomSubset {}'s indices is Value Blocked.\n", psubset->name);
      valid = false;
    }

    if (indices.is_timesamples() || !indices.has_value()) {
      ss << fmt::format("ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n");
      valid = false;
    }

    std::vector<int32_t> subsetIndices;
    if (!indices.get_scalar(&subsetIndices)) {
      ss << fmt::format("ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n");
      valid = false;
    }

    for (const int32_t index : subsetIndices) {
      if (!indicesInFamily.insert(index).second && (familyType != FamilyType::Unrestricted)) {
        ss << fmt::format("Found overlapping index {} in GeomSubset `{}`\n", index, psubset->name);
        valid = false;
      }
    }
  }


  // Make sure every index appears exactly once if it's a partition.
  if ((familyType == FamilyType::Partition) && (indicesInFamily.size() != elementCount)) {
    ss << fmt::format("ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n", indicesInFamily.size(), elementCount);
    valid = false;
  }

  // Ensure that the indices are in the range [0, faceCount)
  size_t maxIndex = static_cast<size_t>(*indicesInFamily.rbegin());
  int minIndex = *indicesInFamily.begin();

  if (maxIndex >= elementCount) {
    ss << fmt::format("ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n", elementCount, maxIndex);

    valid = false;
  }

  if (minIndex < 0) {
    ss << fmt::format("ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n", minIndex);

    valid = false;
  }

  if (!valid) {
    if (err) {
      (*err) += ss.str();
    }
  }

  return true;

}